

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

void __thiscall soul::ValuePrinter::printStringLiteral(ValuePrinter *this,Handle h)

{
  StringDictionary *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_61;
  string local_60;
  string local_40;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  pSVar1 = this->dictionary;
  if (pSVar1 == (StringDictionary *)0x0) {
    std::__cxx11::to_string(&local_60,h.handle);
  }
  else {
    iVar2 = (*(pSVar1->super_StringDictionary)._vptr_StringDictionary[3])(pSVar1);
    local_20._M_len = CONCAT44(extraout_var,iVar2);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_40,&local_20,&local_61);
    choc::text::addDoubleQuotes(&local_60,&local_40);
  }
  (*this->_vptr_ValuePrinter[0x13])(this,local_60._M_string_length,local_60._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_60);
  if (pSVar1 != (StringDictionary *)0x0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void ValuePrinter::printStringLiteral (StringDictionary::Handle h)
{
    print (dictionary != nullptr ? choc::text::addDoubleQuotes (std::string (dictionary->getStringForHandle (h)))
                                 : std::to_string (h.handle));
}